

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

TimeZone * __thiscall
icu_63::TimeZoneFormat::parse
          (TimeZoneFormat *this,UTimeZoneFormatStyle style,UnicodeString *text,ParsePosition *pos,
          int32_t parseOptions,UTimeZoneFormatTimeType *timeType)

{
  short sVar1;
  ushort uVar2;
  uint start;
  bool bVar3;
  UErrorCode UVar4;
  ParsePosition *pPVar5;
  UnicodeString *text_00;
  UTimeZoneFormatTimeType *pUVar6;
  int32_t iVar7;
  int32_t iVar8;
  int iVar9;
  UTimeZoneNameType UVar10;
  uint uVar11;
  undefined4 extraout_var;
  TimeZoneFormat *pTVar12;
  undefined4 extraout_var_00;
  TZDBTimeZoneNames *pTVar13;
  MatchInfoCollection *this_00;
  TimeZoneFormat *pTVar14;
  TimeZoneFormat *this_01;
  UTimeZoneFormatTimeType UVar15;
  int32_t genericNameTypes;
  uint32_t types;
  ulong uVar16;
  int32_t i;
  int idx;
  char cVar17;
  uint uVar18;
  uint uVar19;
  int32_t i_2;
  uint uVar20;
  UErrorCode status;
  ParsePosition tmpPos;
  UBool hasDigitOffset_2;
  UnicodeString tzID;
  UnicodeString parsedID;
  UChar parsedIDBuf [32];
  UChar tzIDBuf [32];
  UErrorCode local_1a8;
  int32_t local_1a4;
  TimeZoneFormat *local_1a0;
  uint local_194;
  ParsePosition local_190;
  TimeZone *local_180;
  ParsePosition *local_178;
  UnicodeString *local_170;
  UTimeZoneFormatTimeType local_164;
  TimeZoneFormat *local_160;
  uint local_154;
  UTimeZoneFormatTimeType *local_150;
  ulong local_148;
  uint local_13c;
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  UTimeZoneFormatTimeType local_b8 [16];
  char local_78 [72];
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if (timeType != (UTimeZoneFormatTimeType *)0x0) {
    *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  }
  start = pos->index;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar20 = (text->fUnion).fFields.fLength;
  }
  else {
    uVar20 = (int)sVar1 >> 5;
  }
  local_190.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003b9398;
  local_190.errorIndex = -1;
  local_190.index = start;
  local_178 = pos;
  local_170 = text;
  local_160 = this;
  local_154 = parseOptions;
  local_150 = timeType;
  if ((((style < UTZFMT_STYLE_SPECIFIC_SHORT & 0xbU >> ((byte)style & 0xf)) == 0) &&
      (style != UTZFMT_STYLE_SPECIFIC_SHORT)) && (style != UTZFMT_STYLE_GENERIC_SHORT)) {
    local_194 = 0;
    local_1a4 = 0x7fffffff;
    uVar18 = 0xffffffff;
  }
  else {
    local_78[0] = '\0';
    iVar7 = parseOffsetLocalizedGMT
                      (this,text,&local_190,(style - UTZFMT_STYLE_GENERIC_SHORT & 0xfffffffd) == 0,
                       local_78);
    local_194 = 0x60;
    local_1a4 = 0x7fffffff;
    bVar3 = true;
    uVar18 = 0xffffffff;
    iVar8 = local_1a4;
    if ((local_190.errorIndex == -1) &&
       ((local_190.index == uVar20 || (uVar18 = local_190.index, iVar8 = iVar7, local_78[0] != '\0')
        ))) {
      local_178->index = local_190.index;
      local_180 = createTimeZoneForOffset(this,iVar7);
      bVar3 = false;
      local_194 = 0;
      uVar18 = 0xffffffff;
      iVar8 = local_1a4;
    }
    local_1a4 = iVar8;
    if (!bVar3) goto LAB_001fe35b;
  }
  local_1a8 = U_ZERO_ERROR;
  pTVar12 = (TimeZoneFormat *)local_138;
  UnicodeString::UnicodeString((UnicodeString *)pTVar12,(UChar *)local_78,0,0x20);
  local_148 = (ulong)style;
  switch(local_148) {
  case 0:
    types = 1;
    goto LAB_001fd9ec;
  case 1:
    types = 3;
    goto LAB_001fd9ec;
  case 2:
    types = 5;
LAB_001fd9ec:
    local_b8[0] = UTZFMT_TIME_TYPE_UNKNOWN;
    pTVar12 = (TimeZoneFormat *)getTimeZoneGenericNames(local_160,&local_1a8);
    iVar9 = 0;
    if (local_1a8 < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar9 = TimeZoneGenericNames::findBestMatch
                        ((TimeZoneGenericNames *)pTVar12,local_170,start,types,
                         (UnicodeString *)local_138,local_b8,&local_1a8);
    }
    if (local_1a8 < U_ILLEGAL_ARGUMENT_ERROR) {
      if (iVar9 < 1) {
        bVar3 = true;
      }
      else {
        if (local_150 != (UTimeZoneFormatTimeType *)0x0) {
          *local_150 = local_b8[0];
        }
        local_178->index = iVar9 + start;
        pTVar12 = (TimeZoneFormat *)local_138;
        local_180 = TimeZone::createTimeZone((UnicodeString *)pTVar12);
        bVar3 = false;
      }
    }
    else {
      local_178->errorIndex = start;
      bVar3 = false;
      local_180 = (TimeZone *)0x0;
    }
    if (bVar3) break;
    goto LAB_001fe34e;
  case 3:
    uVar16 = 6;
    goto LAB_001fd978;
  case 4:
    uVar16 = 0x30;
LAB_001fd978:
    iVar9 = (*(local_160->fTimeZoneNames->super_UObject)._vptr_UObject[0xf])
                      (local_160->fTimeZoneNames,local_170,(ulong)start,uVar16,&local_1a8);
    local_1a0 = (TimeZoneFormat *)CONCAT44(extraout_var,iVar9);
    if (local_1a8 < U_ILLEGAL_ARGUMENT_ERROR) {
      if (local_1a0 != (TimeZoneFormat *)0x0) {
        iVar9 = -1;
        uVar11 = 0xffffffff;
        local_13c = (uint)uVar16;
        for (idx = 0; iVar8 = TimeZoneNames::MatchInfoCollection::size
                                        ((MatchInfoCollection *)local_1a0), idx < iVar8;
            idx = idx + 1) {
          iVar8 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                            ((MatchInfoCollection *)local_1a0,idx);
          uVar11 = iVar8 + start;
          if ((int)uVar18 < (int)uVar11) {
            iVar9 = idx;
            uVar18 = uVar11;
          }
        }
        if (-1 < iVar9) {
          if (local_150 != (UTimeZoneFormatTimeType *)0x0) {
            UVar10 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                               ((MatchInfoCollection *)local_1a0,iVar9);
            UVar15 = UTZFMT_TIME_TYPE_STANDARD;
            if ((int)UVar10 < 0x10) {
              if (UVar10 != UTZNM_LONG_STANDARD) {
                if (UVar10 != UTZNM_LONG_DAYLIGHT) goto LAB_001fdbf9;
LAB_001fdfa7:
                UVar15 = UTZFMT_TIME_TYPE_DAYLIGHT;
              }
            }
            else if (UVar10 != UTZNM_SHORT_STANDARD) {
              if (UVar10 == UTZNM_SHORT_DAYLIGHT) goto LAB_001fdfa7;
LAB_001fdbf9:
              UVar15 = UTZFMT_TIME_TYPE_UNKNOWN;
            }
            *local_150 = UVar15;
          }
          local_178->index = uVar11;
          getTimeZoneID(local_160,(MatchInfoCollection *)local_1a0,iVar9,(UnicodeString *)local_138)
          ;
          local_180 = TimeZone::createTimeZone((UnicodeString *)local_138);
        }
        if (-1 < iVar9) {
          cVar17 = '\0';
          goto LAB_001fd9c2;
        }
        uVar16 = (ulong)local_13c;
      }
      cVar17 = '\x01';
      if ((style == UTZFMT_STYLE_SPECIFIC_SHORT && (local_154 & 2) != 0) &&
         (pTVar13 = getTZDBTimeZoneNames(local_160,&local_1a8), local_1a8 < U_ILLEGAL_ARGUMENT_ERROR
         )) {
        iVar9 = (*(pTVar13->super_TimeZoneNames).super_UObject._vptr_UObject[0xf])
                          (pTVar13,local_170,(ulong)start,uVar16,&local_1a8);
        this_00 = (MatchInfoCollection *)CONCAT44(extraout_var_01,iVar9);
        if (local_1a8 < U_ILLEGAL_ARGUMENT_ERROR) {
          if (this_00 == (MatchInfoCollection *)0x0) {
            cVar17 = '\x01';
          }
          else {
            uVar16 = 0xffffffff;
            uVar19 = 0xffffffff;
            for (uVar11 = 0; iVar8 = TimeZoneNames::MatchInfoCollection::size(this_00),
                (int)uVar11 < iVar8; uVar11 = uVar11 + 1) {
              iVar8 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(this_00,uVar11);
              uVar19 = iVar8 + start;
              if ((int)uVar18 < (int)uVar19) {
                uVar16 = (ulong)uVar11;
                uVar18 = uVar19;
              }
            }
            iVar9 = (int)uVar16;
            cVar17 = (char)(uVar16 >> 0x1f);
            if (-1 < iVar9) {
              if (local_150 != (UTimeZoneFormatTimeType *)0x0) {
                UVar10 = TimeZoneNames::MatchInfoCollection::getNameTypeAt(this_00,iVar9);
                UVar15 = UTZFMT_TIME_TYPE_STANDARD;
                if ((int)UVar10 < 0x10) {
                  if (UVar10 != UTZNM_LONG_STANDARD) {
                    if (UVar10 != UTZNM_LONG_DAYLIGHT) goto LAB_001fe501;
LAB_001fe53e:
                    UVar15 = UTZFMT_TIME_TYPE_DAYLIGHT;
                  }
                }
                else if (UVar10 != UTZNM_SHORT_STANDARD) {
                  if (UVar10 == UTZNM_SHORT_DAYLIGHT) goto LAB_001fe53e;
LAB_001fe501:
                  UVar15 = UTZFMT_TIME_TYPE_UNKNOWN;
                }
                *local_150 = UVar15;
              }
              local_178->index = uVar19;
              getTimeZoneID(local_160,this_00,iVar9,(UnicodeString *)local_138);
              local_180 = TimeZone::createTimeZone((UnicodeString *)local_138);
            }
          }
        }
        else {
          local_178->errorIndex = start;
          cVar17 = '\0';
          local_180 = (TimeZone *)0x0;
        }
        if (this_00 != (MatchInfoCollection *)0x0) {
          (*this_00->_vptr_MatchInfoCollection[1])(this_00);
        }
      }
    }
    else {
      local_178->errorIndex = start;
      cVar17 = '\0';
      local_180 = (TimeZone *)0x0;
    }
LAB_001fd9c2:
    pTVar12 = local_1a0;
    if (local_1a0 != (TimeZoneFormat *)0x0) {
      (*(local_1a0->super_Format).super_UObject._vptr_UObject[1])();
    }
    if (cVar17 != '\0') break;
    goto LAB_001fe34e;
  case 5:
    local_190.errorIndex = -1;
    pTVar12 = local_160;
    local_190.index = start;
    iVar8 = parseOffsetLocalizedGMT(local_160,local_170,&local_190,'\0',(UBool *)0x0);
    uVar11 = local_190.index;
    if (local_190.errorIndex != -1) {
      local_194 = local_194 | 0x40;
      break;
    }
    goto LAB_001fdc11;
  case 6:
    local_190.errorIndex = -1;
    pTVar12 = local_160;
    local_190.index = start;
    iVar8 = parseOffsetLocalizedGMT(local_160,local_170,&local_190,'\x01',(UBool *)0x0);
    uVar11 = local_190.index;
    if (local_190.errorIndex == -1) goto LAB_001fdc11;
    local_194 = local_194 | 0x20;
    break;
  case 7:
  case 9:
  case 0xb:
  case 0xd:
  case 0xf:
    local_190.errorIndex = -1;
    local_190.index = start;
    iVar8 = parseOffsetISO8601(pTVar12,local_170,&local_190,'\0',(UBool *)0x0);
    uVar11 = local_190.index;
    if (local_190.errorIndex == -1) goto LAB_001fdc11;
    break;
  case 8:
  case 10:
  case 0xc:
  case 0xe:
  case 0x10:
    local_190.errorIndex = -1;
    local_b8[0] = local_b8[0] & 0xffffff00;
    local_190.index = start;
    iVar8 = parseOffsetISO8601(pTVar12,local_170,&local_190,'\0',(UBool *)local_b8);
    if ((undefined1)local_b8[0] == UTZFMT_TIME_TYPE_UNKNOWN || local_190.errorIndex != -1) break;
    local_178->index = local_190.index;
    local_180 = createTimeZoneForOffset(pTVar12,iVar8);
    goto LAB_001fe34e;
  case 0x11:
    local_190.errorIndex = -1;
    local_190.index = start;
    parseZoneID(pTVar12,local_170,&local_190,(UnicodeString *)local_138);
    goto LAB_001fdb41;
  case 0x12:
    local_190.errorIndex = -1;
    local_190.index = start;
    parseShortZoneID(pTVar12,local_170,&local_190,(UnicodeString *)local_138);
    goto LAB_001fdb41;
  case 0x13:
    local_190.errorIndex = -1;
    pTVar12 = local_160;
    local_190.index = start;
    parseExemplarLocation(local_160,local_170,&local_190,(UnicodeString *)local_138);
LAB_001fdb41:
    if (local_190.errorIndex != -1) break;
    local_178->index = local_190.index;
    local_180 = TimeZone::createTimeZone((UnicodeString *)local_138);
    goto LAB_001fe34e;
  }
  uVar11 = uVar18;
  iVar8 = local_1a4;
  if ((int)start < (int)uVar18) {
LAB_001fdc11:
    local_1a4 = iVar8;
    local_178->index = uVar11;
    local_180 = createTimeZoneForOffset(pTVar12,local_1a4);
  }
  else {
    uVar2 = *(ushort *)(STYLE_PARSE_FLAGS + local_148 * 2);
    pTVar12 = (TimeZoneFormat *)local_f8;
    UnicodeString::UnicodeString((UnicodeString *)pTVar12,(UChar *)local_b8,0,0x20);
    local_194 = local_194 | uVar2;
    if (((int)uVar18 < (int)uVar20) && ((local_194 & 0x180) != 0x180)) {
      local_190.errorIndex = -1;
      local_164 = local_164 & 0xffffff00;
      local_190.index = start;
      iVar8 = parseOffsetISO8601(pTVar12,local_170,&local_190,'\0',(UBool *)&local_164);
      bVar3 = true;
      if (local_190.errorIndex == -1) {
        if ((local_190.index == uVar20) || ((undefined1)local_164 != UTZFMT_TIME_TYPE_UNKNOWN)) {
          local_178->index = local_190.index;
          local_180 = createTimeZoneForOffset(pTVar12,iVar8);
          bVar3 = false;
        }
        else if ((int)uVar18 < local_190.index) {
          pTVar12 = (TimeZoneFormat *)local_f8;
          UnicodeString::setToBogus((UnicodeString *)pTVar12);
          uVar18 = local_190.index;
          local_1a4 = iVar8;
        }
      }
      if (bVar3) goto LAB_001fdd01;
    }
    else {
LAB_001fdd01:
      if (((int)uVar18 < (int)uVar20) && ((local_194 & 0x20) == 0)) {
        local_190.errorIndex = -1;
        local_164 = local_164 & 0xffffff00;
        pTVar12 = local_160;
        local_190.index = start;
        iVar8 = parseOffsetLocalizedGMT(local_160,local_170,&local_190,'\0',(UBool *)&local_164);
        bVar3 = true;
        if (local_190.errorIndex == -1) {
          if ((local_190.index == uVar20) || ((undefined1)local_164 != UTZFMT_TIME_TYPE_UNKNOWN)) {
            local_178->index = local_190.index;
            local_180 = createTimeZoneForOffset(pTVar12,iVar8);
            bVar3 = false;
          }
          else if ((int)uVar18 < local_190.index) {
            pTVar12 = (TimeZoneFormat *)local_f8;
            UnicodeString::setToBogus((UnicodeString *)pTVar12);
            uVar18 = local_190.index;
            local_1a4 = iVar8;
          }
        }
        if (!bVar3) goto LAB_001fe341;
      }
      if (((int)uVar18 < (int)uVar20) && ((local_194 & 0x40) == 0)) {
        local_190.errorIndex = -1;
        local_164 = local_164 & 0xffffff00;
        pTVar12 = local_160;
        local_190.index = start;
        iVar8 = parseOffsetLocalizedGMT(local_160,local_170,&local_190,'\x01',(UBool *)&local_164);
        bVar3 = true;
        if (local_190.errorIndex == -1) {
          if ((local_190.index == uVar20) || ((undefined1)local_164 != UTZFMT_TIME_TYPE_UNKNOWN)) {
            local_178->index = local_190.index;
            local_180 = createTimeZoneForOffset(pTVar12,iVar8);
            bVar3 = false;
          }
          else if ((int)uVar18 < local_190.index) {
            pTVar12 = (TimeZoneFormat *)local_f8;
            UnicodeString::setToBogus((UnicodeString *)pTVar12);
            uVar18 = local_190.index;
            local_1a4 = iVar8;
          }
        }
        if (!bVar3) goto LAB_001fe341;
      }
      if ((local_154 & 1) == 0) {
        local_1a0 = (TimeZoneFormat *)0x0;
      }
      else {
        if ((int)uVar18 < (int)uVar20) {
          pTVar12 = (TimeZoneFormat *)local_160->fTimeZoneNames;
          iVar9 = (*(pTVar12->super_Format).super_UObject._vptr_UObject[0xf])
                            (pTVar12,local_170,(ulong)start,0x76,&local_1a8);
          pTVar14 = (TimeZoneFormat *)CONCAT44(extraout_var_00,iVar9);
          local_148 = CONCAT44(local_148._4_4_,local_1a8);
          if (local_1a8 < U_ILLEGAL_ARGUMENT_ERROR) {
            if (pTVar14 == (TimeZoneFormat *)0x0) {
              iVar8 = -1;
              uVar11 = 0xffffffff;
            }
            else {
              iVar8 = -1;
              uVar11 = 0xffffffff;
              for (iVar9 = 0; pTVar12 = pTVar14,
                  iVar7 = TimeZoneNames::MatchInfoCollection::size((MatchInfoCollection *)pTVar14),
                  iVar9 < iVar7; iVar9 = iVar9 + 1) {
                iVar7 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                  ((MatchInfoCollection *)pTVar14,iVar9);
                if ((int)uVar11 < (int)(iVar7 + start)) {
                  iVar8 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                    ((MatchInfoCollection *)pTVar14,iVar9);
                  uVar11 = iVar8 + start;
                  iVar8 = iVar9;
                }
              }
            }
            local_1a0 = (TimeZoneFormat *)0x0;
            if ((int)uVar18 < (int)uVar11) {
              getTimeZoneID(local_160,(MatchInfoCollection *)pTVar14,iVar8,(UnicodeString *)local_f8
                           );
              pTVar12 = pTVar14;
              UVar10 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                                 ((MatchInfoCollection *)pTVar14,iVar8);
              local_1a4 = 0x7fffffff;
              uVar18 = uVar11;
              if ((int)UVar10 < 0x10) {
                if (UVar10 == UTZNM_LONG_STANDARD) {
LAB_001fe0ee:
                  local_1a0 = (TimeZoneFormat *)0x1;
                }
                else if (UVar10 == UTZNM_LONG_DAYLIGHT) {
LAB_001fe0e7:
                  local_1a0 = (TimeZoneFormat *)0x2;
                }
              }
              else {
                if (UVar10 == UTZNM_SHORT_STANDARD) goto LAB_001fe0ee;
                if (UVar10 == UTZNM_SHORT_DAYLIGHT) goto LAB_001fe0e7;
              }
            }
          }
          else {
            local_178->errorIndex = start;
            local_1a0 = (TimeZoneFormat *)0x0;
            local_180 = (TimeZone *)0x0;
          }
          if (pTVar14 != (TimeZoneFormat *)0x0) {
            (*(pTVar14->super_Format).super_UObject._vptr_UObject[1])();
            pTVar12 = pTVar14;
          }
          if (0 < (int)local_148) goto LAB_001fe341;
        }
        else {
          local_1a0 = (TimeZoneFormat *)0x0;
        }
        if ((((local_154 & 2) != 0) && ((int)uVar18 < (int)uVar20)) && ((local_194 & 0x10) == 0)) {
          pTVar12 = local_160;
          pTVar14 = (TimeZoneFormat *)getTZDBTimeZoneNames(local_160,&local_1a8);
          cVar17 = '\x01';
          if (local_1a8 < U_ILLEGAL_ARGUMENT_ERROR) {
            iVar9 = (*(pTVar14->super_Format).super_UObject._vptr_UObject[0xf])
                              (pTVar14,local_170,(ulong)start,0x76,&local_1a8);
            this_01 = (TimeZoneFormat *)CONCAT44(extraout_var_02,iVar9);
            cVar17 = local_1a8 < U_ILLEGAL_ARGUMENT_ERROR;
            if (local_1a8 < U_ILLEGAL_ARGUMENT_ERROR) {
              if (this_01 == (TimeZoneFormat *)0x0) {
                iVar8 = -1;
                uVar11 = 0xffffffff;
              }
              else {
                local_154 = CONCAT31(local_154._1_3_,cVar17);
                iVar8 = -1;
                uVar11 = 0xffffffff;
                for (iVar9 = 0; pTVar14 = this_01,
                    iVar7 = TimeZoneNames::MatchInfoCollection::size((MatchInfoCollection *)this_01)
                    , iVar9 < iVar7; iVar9 = iVar9 + 1) {
                  iVar7 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                    ((MatchInfoCollection *)this_01,iVar9);
                  if ((int)uVar11 < (int)(iVar7 + start)) {
                    iVar8 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt
                                      ((MatchInfoCollection *)this_01,iVar9);
                    uVar11 = iVar8 + start;
                    iVar8 = iVar9;
                  }
                }
                cVar17 = (char)local_154;
              }
              if ((int)uVar18 < (int)uVar11) {
                getTimeZoneID(local_160,(MatchInfoCollection *)this_01,iVar8,
                              (UnicodeString *)local_f8);
                pTVar14 = this_01;
                UVar10 = TimeZoneNames::MatchInfoCollection::getNameTypeAt
                                   ((MatchInfoCollection *)this_01,iVar8);
                local_1a4 = 0x7fffffff;
                uVar18 = uVar11;
                if ((int)UVar10 < 0x10) {
                  if (UVar10 == UTZNM_LONG_STANDARD) {
LAB_001fe51a:
                    local_1a0 = (TimeZoneFormat *)0x1;
                  }
                  else {
                    if (UVar10 != UTZNM_LONG_DAYLIGHT) goto LAB_001fe298;
LAB_001fe513:
                    local_1a0 = (TimeZoneFormat *)0x2;
                  }
                }
                else {
                  if (UVar10 == UTZNM_SHORT_STANDARD) goto LAB_001fe51a;
                  if (UVar10 == UTZNM_SHORT_DAYLIGHT) goto LAB_001fe513;
LAB_001fe298:
                  local_1a0 = (TimeZoneFormat *)0x0;
                }
              }
            }
            else {
              local_178->errorIndex = start;
              local_180 = (TimeZone *)0x0;
            }
            pTVar12 = pTVar14;
            if (this_01 != (TimeZoneFormat *)0x0) {
              (*(this_01->super_Format).super_UObject._vptr_UObject[1])();
              pTVar12 = this_01;
            }
          }
          if (cVar17 == '\0') goto LAB_001fe341;
        }
        if ((int)uVar18 < (int)uVar20) {
          local_164 = UTZFMT_TIME_TYPE_UNKNOWN;
          pTVar12 = local_160;
          pTVar14 = (TimeZoneFormat *)getTimeZoneGenericNames(local_160,&local_1a8);
          iVar8 = -1;
          if (local_1a8 < U_ILLEGAL_ARGUMENT_ERROR) {
            iVar8 = TimeZoneGenericNames::findBestMatch
                              ((TimeZoneGenericNames *)pTVar14,local_170,start,7,
                               (UnicodeString *)local_138,&local_164,&local_1a8);
            pTVar12 = pTVar14;
          }
          UVar4 = local_1a8;
          if (local_1a8 < U_ILLEGAL_ARGUMENT_ERROR) {
            if ((0 < iVar8) && ((int)uVar18 < (int)(iVar8 + start))) {
              pTVar12 = (TimeZoneFormat *)local_f8;
              UnicodeString::copyFrom((UnicodeString *)pTVar12,(UnicodeString *)local_138,'\0');
              local_1a4 = 0x7fffffff;
              local_1a0 = (TimeZoneFormat *)(ulong)local_164;
              uVar18 = iVar8 + start;
            }
          }
          else {
            local_178->errorIndex = start;
            local_180 = (TimeZone *)0x0;
          }
          if (U_ZERO_ERROR < UVar4) goto LAB_001fe341;
        }
        text_00 = local_170;
        uVar11 = local_194 & 0x200;
        if (((int)uVar18 < (int)uVar20) && (uVar11 == 0)) {
          local_190.errorIndex = -1;
          local_190.index = start;
          parseZoneID(pTVar12,local_170,&local_190,(UnicodeString *)local_138);
          iVar8 = local_190.index;
          if ((local_190.errorIndex == -1) && ((int)uVar18 < local_190.index)) {
            local_1a0 = (TimeZoneFormat *)0x0;
            local_1a4 = 0x7fffffff;
            pTVar12 = (TimeZoneFormat *)local_f8;
            UnicodeString::copyFrom((UnicodeString *)pTVar12,(UnicodeString *)local_138,'\0');
            uVar18 = iVar8;
          }
        }
        if (((int)uVar18 < (int)uVar20) && (uVar11 == 0)) {
          local_190.errorIndex = -1;
          local_190.index = start;
          parseShortZoneID(pTVar12,text_00,&local_190,(UnicodeString *)local_138);
          iVar8 = local_190.index;
          if ((local_190.errorIndex == -1) && ((int)uVar18 < local_190.index)) {
            local_1a0 = (TimeZoneFormat *)0x0;
            local_1a4 = 0x7fffffff;
            pTVar12 = (TimeZoneFormat *)local_f8;
            UnicodeString::copyFrom((UnicodeString *)pTVar12,(UnicodeString *)local_138,'\0');
            uVar18 = iVar8;
          }
        }
      }
      pUVar6 = local_150;
      pPVar5 = local_178;
      if ((int)start < (int)uVar18) {
        if (-1 < (short)local_f8._8_2_) {
          local_f8._12_4_ = (int)(short)local_f8._8_2_ >> 5;
        }
        if ((int)local_f8._12_4_ < 1) {
          local_180 = createTimeZoneForOffset(pTVar12,local_1a4);
        }
        else {
          local_180 = TimeZone::createTimeZone((UnicodeString *)local_f8);
        }
        if (pUVar6 != (UTimeZoneFormatTimeType *)0x0) {
          *pUVar6 = (UTimeZoneFormatTimeType)local_1a0;
        }
        pPVar5->index = uVar18;
      }
      else {
        local_178->errorIndex = start;
        local_180 = (TimeZone *)0x0;
      }
    }
LAB_001fe341:
    UnicodeString::~UnicodeString((UnicodeString *)local_f8);
  }
LAB_001fe34e:
  UnicodeString::~UnicodeString((UnicodeString *)local_138);
LAB_001fe35b:
  ParsePosition::~ParsePosition(&local_190);
  return local_180;
}

Assistant:

TimeZone*
TimeZoneFormat::parse(UTimeZoneFormatStyle style, const UnicodeString& text, ParsePosition& pos,
        int32_t parseOptions, UTimeZoneFormatTimeType* timeType /* = NULL */) const {
    if (timeType) {
        *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    }

    int32_t startIdx = pos.getIndex();
    int32_t maxPos = text.length();
    int32_t offset;

    // Styles using localized GMT format as fallback
    UBool fallbackLocalizedGMT = 
        (style == UTZFMT_STYLE_SPECIFIC_LONG || style == UTZFMT_STYLE_GENERIC_LONG || style == UTZFMT_STYLE_GENERIC_LOCATION);
    UBool fallbackShortLocalizedGMT =
        (style == UTZFMT_STYLE_SPECIFIC_SHORT || style == UTZFMT_STYLE_GENERIC_SHORT);

    int32_t evaluated = 0;  // bit flags representing already evaluated styles
    ParsePosition tmpPos(startIdx);

    int32_t parsedOffset = UNKNOWN_OFFSET;  // stores successfully parsed offset for later use
    int32_t parsedPos = -1;                 // stores successfully parsed offset position for later use

    // Try localized GMT format first if necessary
    if (fallbackLocalizedGMT || fallbackShortLocalizedGMT) {
        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, fallbackShortLocalizedGMT, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            // Even when the input text was successfully parsed as a localized GMT format text,
            // we may still need to evaluate the specified style if -
            //   1) GMT zero format was used, and
            //   2) The input text was not completely processed
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            parsedOffset = offset;
            parsedPos = tmpPos.getIndex();
        }
        // Note: For now, no distinction between long/short localized GMT format in the parser.
        // This might be changed in future.
        // evaluated |= (fallbackLocalizedGMT ? STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT] : STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT]);
        evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT] | STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT];
    }

    UErrorCode status = U_ZERO_ERROR;
    UChar tzIDBuf[32];
    UnicodeString tzID(tzIDBuf, 0, UPRV_LENGTHOF(tzIDBuf));

    UBool parseTZDBAbbrev = ((parseOptions & UTZFMT_PARSE_OPTION_TZ_DATABASE_ABBREVIATIONS) != 0);

    // Try the specified style
    switch (style) {
    case UTZFMT_STYLE_LOCALIZED_GMT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetLocalizedGMT(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            // Note: For now, no distinction between long/short localized GMT format in the parser.
            // This might be changed in future.
            evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT];

            break;
        }
    case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetShortLocalizedGMT(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            // Note: For now, no distinction between long/short localized GMT format in the parser.
            // This might be changed in future.
            evaluated |= STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT];

            break;
        }
    case UTZFMT_STYLE_ISO_BASIC_SHORT:
    case UTZFMT_STYLE_ISO_BASIC_FIXED:
    case UTZFMT_STYLE_ISO_BASIC_FULL:
    case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
    case UTZFMT_STYLE_ISO_EXTENDED_FULL:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            offset = parseOffsetISO8601(text, tmpPos);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            break;
        }

    case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
    case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
    case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
    case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
    case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            // Exclude the case of UTC Indicator "Z" here
            UBool hasDigitOffset = FALSE;
            offset = parseOffsetISO8601(text, tmpPos, FALSE, &hasDigitOffset);
            if (tmpPos.getErrorIndex() == -1 && hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }

            break;
        }

    case UTZFMT_STYLE_SPECIFIC_LONG:
    case UTZFMT_STYLE_SPECIFIC_SHORT:
        {
            // Specific styles
            int32_t nameTypes = 0;
            if (style == UTZFMT_STYLE_SPECIFIC_LONG) {
                nameTypes = (UTZNM_LONG_STANDARD | UTZNM_LONG_DAYLIGHT);
            } else {
                U_ASSERT(style == UTZFMT_STYLE_SPECIFIC_SHORT);
                nameTypes = (UTZNM_SHORT_STANDARD | UTZNM_SHORT_DAYLIGHT);
            }
            LocalPointer<TimeZoneNames::MatchInfoCollection> specificMatches(fTimeZoneNames->find(text, startIdx, nameTypes, status));
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            if (!specificMatches.isNull()) {
                int32_t matchIdx = -1;
                int32_t matchPos = -1;
                for (int32_t i = 0; i < specificMatches->size(); i++) {
                    matchPos  = startIdx + specificMatches->getMatchLengthAt(i);
                    if (matchPos > parsedPos) {
                        matchIdx = i;
                        parsedPos = matchPos;
                    }
                }
                if (matchIdx >= 0) {
                    if (timeType) {
                        *timeType = getTimeType(specificMatches->getNameTypeAt(matchIdx));
                    }
                    pos.setIndex(matchPos);
                    getTimeZoneID(specificMatches.getAlias(), matchIdx, tzID);
                    U_ASSERT(!tzID.isEmpty());
                    return TimeZone::createTimeZone(tzID);
                }
            }

            if (parseTZDBAbbrev && style == UTZFMT_STYLE_SPECIFIC_SHORT) {
                U_ASSERT((nameTypes & UTZNM_SHORT_STANDARD) != 0);
                U_ASSERT((nameTypes & UTZNM_SHORT_DAYLIGHT) != 0);

                const TZDBTimeZoneNames *tzdbTimeZoneNames = getTZDBTimeZoneNames(status);
                if (U_SUCCESS(status)) {
                    LocalPointer<TimeZoneNames::MatchInfoCollection> tzdbNameMatches(
                        tzdbTimeZoneNames->find(text, startIdx, nameTypes, status));
                    if (U_FAILURE(status)) {
                        pos.setErrorIndex(startIdx);
                        return NULL;
                    }
                    if (!tzdbNameMatches.isNull()) {
                        int32_t matchIdx = -1;
                        int32_t matchPos = -1;
                        for (int32_t i = 0; i < tzdbNameMatches->size(); i++) {
                            matchPos = startIdx + tzdbNameMatches->getMatchLengthAt(i);
                            if (matchPos > parsedPos) {
                                matchIdx = i;
                                parsedPos = matchPos;
                            }
                        }
                        if (matchIdx >= 0) {
                            if (timeType) {
                                *timeType = getTimeType(tzdbNameMatches->getNameTypeAt(matchIdx));
                            }
                            pos.setIndex(matchPos);
                            getTimeZoneID(tzdbNameMatches.getAlias(), matchIdx, tzID);
                            U_ASSERT(!tzID.isEmpty());
                            return TimeZone::createTimeZone(tzID);
                        }
                    }
                }
            }
            break;
        }
    case UTZFMT_STYLE_GENERIC_LONG:
    case UTZFMT_STYLE_GENERIC_SHORT:
    case UTZFMT_STYLE_GENERIC_LOCATION:
        {
            int32_t genericNameTypes = 0;
            switch (style) {
            case UTZFMT_STYLE_GENERIC_LOCATION:
                genericNameTypes = UTZGNM_LOCATION;
                break;

            case UTZFMT_STYLE_GENERIC_LONG:
                genericNameTypes = UTZGNM_LONG | UTZGNM_LOCATION;
                break;

            case UTZFMT_STYLE_GENERIC_SHORT:
                genericNameTypes = UTZGNM_SHORT | UTZGNM_LOCATION;
                break;

            default:
                U_ASSERT(FALSE);
            }

            int32_t len = 0;
            UTimeZoneFormatTimeType tt = UTZFMT_TIME_TYPE_UNKNOWN;
            const TimeZoneGenericNames *gnames = getTimeZoneGenericNames(status);
            if (U_SUCCESS(status)) {
                len = gnames->findBestMatch(text, startIdx, genericNameTypes, tzID, tt, status);
            }
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            if (len > 0) {
                // Found a match
                if (timeType) {
                    *timeType = tt;
                }
                pos.setIndex(startIdx + len);
                U_ASSERT(!tzID.isEmpty());
                return TimeZone::createTimeZone(tzID);
            }

            break;
        }
    case UTZFMT_STYLE_ZONE_ID:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    case UTZFMT_STYLE_ZONE_ID_SHORT:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseShortZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    case UTZFMT_STYLE_EXEMPLAR_LOCATION:
        {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseExemplarLocation(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1) {
                pos.setIndex(tmpPos.getIndex());
                return TimeZone::createTimeZone(tzID);
            }
            break;
        }
    }
    evaluated |= STYLE_PARSE_FLAGS[style];


    if (parsedPos > startIdx) {
        // When the specified style is one of SPECIFIC_XXX or GENERIC_XXX, we tried to parse the input
        // as localized GMT format earlier. If parsedOffset is positive, it means it was successfully
        // parsed as localized GMT format, but offset digits were not detected (more specifically, GMT
        // zero format). Then, it tried to find a match within the set of display names, but could not
        // find a match. At this point, we can safely assume the input text contains the localized
        // GMT format.
        U_ASSERT(parsedOffset != UNKNOWN_OFFSET);
        pos.setIndex(parsedPos);
        return createTimeZoneForOffset(parsedOffset);
    }

    // Failed to parse the input text as the time zone format in the specified style.
    // Check the longest match among other styles below.
    UChar parsedIDBuf[32];
    UnicodeString parsedID(parsedIDBuf, 0, UPRV_LENGTHOF(parsedIDBuf));
    UTimeZoneFormatTimeType parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;

    U_ASSERT(parsedPos < 0);
    U_ASSERT(parsedOffset == UNKNOWN_OFFSET);

    // ISO 8601
    if (parsedPos < maxPos &&
        ((evaluated & ISO_Z_STYLE_FLAG) == 0 || (evaluated & ISO_LOCAL_STYLE_FLAG) == 0)) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetISO8601(text, tmpPos, FALSE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Note: When ISO 8601 format contains offset digits, it should not
            // collide with other formats. However, ISO 8601 UTC format "Z" (single letter)
            // may collide with other names. In this case, we need to evaluate other names.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
                U_ASSERT(parsedPos == startIdx + 1);    // only when "Z" is used
            }
        }
    }

    // Localized GMT format
    if (parsedPos < maxPos &&
        (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT]) == 0) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, FALSE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Evaluate other names - see the comment earlier in this method.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
            }
        }
    }

    if (parsedPos < maxPos &&
        (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_LOCALIZED_GMT_SHORT]) == 0) {
        tmpPos.setIndex(startIdx);
        tmpPos.setErrorIndex(-1);

        UBool hasDigitOffset = FALSE;
        offset = parseOffsetLocalizedGMT(text, tmpPos, TRUE, &hasDigitOffset);
        if (tmpPos.getErrorIndex() == -1) {
            if (tmpPos.getIndex() == maxPos || hasDigitOffset) {
                pos.setIndex(tmpPos.getIndex());
                return createTimeZoneForOffset(offset);
            }
            // Evaluate other names - see the comment earlier in this method.
            if (parsedPos < tmpPos.getIndex()) {
                parsedOffset = offset;
                parsedID.setToBogus();
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedPos = tmpPos.getIndex();
            }
        }
    }

    // When ParseOption.ALL_STYLES is available, we also try to look all possible display names and IDs.
    // For example, when style is GENERIC_LONG, "EST" (SPECIFIC_SHORT) is never
    // used for America/New_York. With parseAllStyles true, this code parses "EST"
    // as America/New_York.

    // Note: Adding all possible names into the trie used by the implementation is quite heavy operation,
    // which we want to avoid normally (note that we cache the trie, so this is applicable to the
    // first time only as long as the cache does not expire).

    if (parseOptions & UTZFMT_PARSE_OPTION_ALL_STYLES) {
        // Try all specific names and exemplar location names
        if (parsedPos < maxPos) {
            LocalPointer<TimeZoneNames::MatchInfoCollection> specificMatches(fTimeZoneNames->find(text, startIdx, ALL_SIMPLE_NAME_TYPES, status));
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }
            int32_t specificMatchIdx = -1;
            int32_t matchPos = -1;
            if (!specificMatches.isNull()) {
                for (int32_t i = 0; i < specificMatches->size(); i++) {
                    if (startIdx + specificMatches->getMatchLengthAt(i) > matchPos) {
                        specificMatchIdx = i;
                        matchPos = startIdx + specificMatches->getMatchLengthAt(i);
                    }
                }
            }
            if (parsedPos < matchPos) {
                U_ASSERT(specificMatchIdx >= 0);
                parsedPos = matchPos;
                getTimeZoneID(specificMatches.getAlias(), specificMatchIdx, parsedID);
                parsedTimeType = getTimeType(specificMatches->getNameTypeAt(specificMatchIdx));
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
        if (parseTZDBAbbrev && parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_SPECIFIC_SHORT]) == 0) {
            const TZDBTimeZoneNames *tzdbTimeZoneNames = getTZDBTimeZoneNames(status);
            if (U_SUCCESS(status)) {
                LocalPointer<TimeZoneNames::MatchInfoCollection> tzdbNameMatches(
                    tzdbTimeZoneNames->find(text, startIdx, ALL_SIMPLE_NAME_TYPES, status));
                if (U_FAILURE(status)) {
                    pos.setErrorIndex(startIdx);
                    return NULL;
                }
                int32_t tzdbNameMatchIdx = -1;
                int32_t matchPos = -1;
                if (!tzdbNameMatches.isNull()) {
                    for (int32_t i = 0; i < tzdbNameMatches->size(); i++) {
                        if (startIdx + tzdbNameMatches->getMatchLengthAt(i) > matchPos) {
                            tzdbNameMatchIdx = i;
                            matchPos = startIdx + tzdbNameMatches->getMatchLengthAt(i);
                        }
                    }
                }
                if (parsedPos < matchPos) {
                    U_ASSERT(tzdbNameMatchIdx >= 0);
                    parsedPos = matchPos;
                    getTimeZoneID(tzdbNameMatches.getAlias(), tzdbNameMatchIdx, parsedID);
                    parsedTimeType = getTimeType(tzdbNameMatches->getNameTypeAt(tzdbNameMatchIdx));
                    parsedOffset = UNKNOWN_OFFSET;
                }
            }
        }
        // Try generic names
        if (parsedPos < maxPos) {
            int32_t genMatchLen = -1;
            UTimeZoneFormatTimeType tt = UTZFMT_TIME_TYPE_UNKNOWN;

            const TimeZoneGenericNames *gnames = getTimeZoneGenericNames(status);
            if (U_SUCCESS(status)) {
                genMatchLen = gnames->findBestMatch(text, startIdx, ALL_GENERIC_NAME_TYPES, tzID, tt, status);
            }
            if (U_FAILURE(status)) {
                pos.setErrorIndex(startIdx);
                return NULL;
            }

            if (genMatchLen > 0 && parsedPos < startIdx + genMatchLen) {
                parsedPos = startIdx + genMatchLen;
                parsedID.setTo(tzID);
                parsedTimeType = tt;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }

        // Try time zone ID
        if (parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_ZONE_ID]) == 0) {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1 && parsedPos < tmpPos.getIndex()) {
                parsedPos = tmpPos.getIndex();
                parsedID.setTo(tzID);
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
        // Try short time zone ID
        if (parsedPos < maxPos && (evaluated & STYLE_PARSE_FLAGS[UTZFMT_STYLE_ZONE_ID]) == 0) {
            tmpPos.setIndex(startIdx);
            tmpPos.setErrorIndex(-1);

            parseShortZoneID(text, tmpPos, tzID);
            if (tmpPos.getErrorIndex() == -1 && parsedPos < tmpPos.getIndex()) {
                parsedPos = tmpPos.getIndex();
                parsedID.setTo(tzID);
                parsedTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                parsedOffset = UNKNOWN_OFFSET;
            }
        }
    }

    if (parsedPos > startIdx) {
        // Parsed successfully
        TimeZone* parsedTZ;
        if (parsedID.length() > 0) {
            parsedTZ = TimeZone::createTimeZone(parsedID);
        } else {
            U_ASSERT(parsedOffset != UNKNOWN_OFFSET);
            parsedTZ = createTimeZoneForOffset(parsedOffset);
        }
        if (timeType) {
            *timeType = parsedTimeType;
        }
        pos.setIndex(parsedPos);
        return parsedTZ;
    }

    pos.setErrorIndex(startIdx);
    return NULL;
}